

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_unix.cpp
# Opt level: O0

void __thiscall File::File(File *this,char *fName,uint oflag,uint systemDependentFlags)

{
  uint uVar1;
  int fd_00;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  runtime_error *this_00;
  void *pvVar5;
  string local_1d8 [32];
  ostringstream local_1b8 [8];
  ostringstream ss;
  int fd;
  int sysFlags;
  allocator<char> local_21;
  uint local_20;
  uint local_1c;
  uint systemDependentFlags_local;
  uint oflag_local;
  char *fName_local;
  File *this_local;
  
  local_20 = systemDependentFlags;
  local_1c = oflag;
  _systemDependentFlags_local = fName;
  fName_local = (char *)this;
  AbstractOutputStream::AbstractOutputStream(&this->super_AbstractOutputStream);
  pcVar4 = _systemDependentFlags_local;
  (this->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream =
       (_func_int **)&PTR__File_00442cd8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_name,pcVar4,&local_21);
  std::allocator<char>::~allocator(&local_21);
  this->m_pos = 0;
  uVar1 = anon_unknown.dwarf_2ffb82::makeUnixOpenFlags(local_1c);
  fd_00 = open64(_systemDependentFlags_local,uVar1 | local_20,0x1b0);
  if (fd_00 == -1) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar2 = std::operator<<((ostream *)local_1b8,"Error opening file ");
    poVar2 = std::operator<<(poVar2,_systemDependentFlags_local);
    poVar2 = std::operator<<(poVar2,": ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<(poVar2,"(");
    piVar3 = __errno_location();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar3);
    std::operator<<(poVar2,")");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(this_00,local_1d8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar5 = anon_unknown.dwarf_2ffb82::from_fd(fd_00);
  this->m_impl = pvVar5;
  return;
}

Assistant:

File::File(const char* fName, unsigned int oflag, unsigned int systemDependentFlags) : m_name(fName), m_pos(0)
{
    int sysFlags = makeUnixOpenFlags(oflag);
    auto fd = ::open(fName, sysFlags | systemDependentFlags, S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP);
    if (fd == -1)
    {
        std::ostringstream ss;
        ss << "Error opening file " << fName << ": " << strerror(errno) << "(" << errno << ")";
        throw std::runtime_error(ss.str());
    }
    m_impl = from_fd(fd);
}